

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O1

void duckdb_je_prof_tctx_try_destroy(tsd_t *tsd,prof_tctx_t *tctx)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  prof_tctx_t **pppVar3;
  long *plVar4;
  byte *pbVar5;
  rtree_ctx_cache_elm_t *prVar6;
  undefined8 *puVar7;
  prof_tdata_t *tdata_00;
  void *pvVar8;
  rtree_leaf_elm_t *prVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  int iVar12;
  size_t sVar13;
  undefined1 *puVar14;
  rtree_leaf_elm_t *prVar15;
  prof_tctx_t *ppVar16;
  long lVar17;
  ulong uVar18;
  _Bool even_if_attached;
  prof_tctx_t *tnode;
  prof_tctx_t *ppVar19;
  rtree_ctx_cache_elm_t *prVar20;
  rtree_ctx_cache_elm_t *prVar21;
  malloc_mutex_t *pmVar22;
  prof_tctx_t *ppVar23;
  prof_tctx_t *ppVar24;
  ulong uVar25;
  prof_gctx_t *ppVar26;
  long *plVar27;
  rtree_leaf_elm_t *prVar28;
  uint uVar29;
  ulong *puVar30;
  prof_tdata_t *tdata;
  rtree_ctx_t *prVar31;
  bool bVar32;
  undefined1 local_848 [8];
  prof_gctx_t *local_840;
  rtree_ctx_t local_838 [5];
  
  tdata_00 = tctx->tdata;
  if ((((duckdb_je_opt_prof_accum) || ((tctx->cnts).curobjs != 0)) || (tctx->prepared != false)) ||
     (tctx->recent_count != 0)) {
    pmVar22 = tdata_00->lock;
LAB_01db750c:
    (pmVar22->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar22->field_0 + 0x48));
    return;
  }
  ppVar26 = tctx->gctx;
  tctx->tdata = (prof_tdata_t *)0x0;
  duckdb_je_ckh_remove(tsd,&tdata_00->bt2tctx,&ppVar26->bt,(void **)0x0,(void **)0x0);
  if (tdata_00->attached == false) {
    sVar13 = duckdb_je_ckh_count(&tdata_00->bt2tctx);
    pmVar22 = tdata_00->lock;
    (pmVar22->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar22->field_0 + 0x48));
    if (sVar13 == 0) {
      prof_tdata_destroy(tsd,tdata_00,even_if_attached);
    }
  }
  else {
    pmVar22 = tdata_00->lock;
    (pmVar22->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar22->field_0 + 0x48));
  }
  pmVar22 = ppVar26->lock;
  iVar12 = pthread_mutex_trylock((pthread_mutex_t *)((long)&pmVar22->field_0 + 0x48));
  if (iVar12 != 0) {
    duckdb_je_malloc_mutex_lock_slow(pmVar22);
    (pmVar22->field_0).field_0.locked.repr = true;
  }
  puVar1 = &(pmVar22->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((pmVar22->field_0).field_0.prof_data.prev_owner)->tsd != tsd) {
    (pmVar22->field_0).field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    ppwVar2 = &(pmVar22->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (tctx->state != prof_tctx_state_nominal) {
    tctx->state = prof_tctx_state_purgatory;
    pmVar22 = ppVar26->lock;
    goto LAB_01db750c;
  }
  local_840 = ppVar26;
  ppVar16 = (ppVar26->tctxs).rbt_root;
  local_838[0].cache[0].leafkey = (uintptr_t)ppVar16;
  puVar30 = (ulong *)0x0;
  puVar10 = local_848;
  while (puVar11 = puVar10 + 0x10, puVar14 = puVar11, ppVar16 != (prof_tctx_t *)0x0) {
    iVar12 = prof_tctx_comp(tctx,ppVar16);
    *(int *)(puVar10 + 0x18) = iVar12;
    if (iVar12 < 0) {
      *(prof_tctx_t **)(puVar10 + 0x20) = (ppVar16->tctx_link).rbn_left;
      bVar32 = true;
    }
    else {
      uVar18 = (ulong)(ppVar16->tctx_link).rbn_right_red & 0xfffffffffffffffe;
      *(ulong *)(puVar10 + 0x20) = uVar18;
      bVar32 = true;
      if (iVar12 == 0) {
        puVar14 = puVar10 + 0x20;
        *(undefined4 *)(puVar10 + 0x18) = 1;
        while (uVar18 != 0) {
          *(undefined4 *)(puVar14 + 8) = 0xffffffff;
          uVar18 = *(ulong *)(uVar18 + 0x70);
          *(ulong *)(puVar14 + 0x10) = uVar18;
          puVar14 = puVar14 + 0x10;
        }
        bVar32 = false;
        puVar30 = (ulong *)puVar11;
      }
    }
    if (!bVar32) break;
    puVar10 = puVar14;
    ppVar16 = *(prof_tctx_t **)(puVar14 + 0x10);
  }
  puVar10 = puVar14 + -0x10;
  ppVar16 = *(prof_tctx_t **)(puVar14 + -0x10);
  if (ppVar16 == tctx) {
    ppVar16 = (tctx->tctx_link).rbn_left;
    ppVar26 = local_840;
    if (ppVar16 != (prof_tctx_t *)0x0) {
      pppVar3 = &(ppVar16->tctx_link).rbn_right_red;
      *(byte *)pppVar3 = *(byte *)pppVar3 & 0xfe;
      if (puVar10 == local_848 + 0x10) {
        (local_840->tctxs).rbt_root = ppVar16;
      }
      else if (*(int *)(puVar14 + -0x18) < 0) {
        *(prof_tctx_t **)(*(long *)(puVar14 + -0x20) + 0x70) = ppVar16;
      }
      else {
        *(ulong *)(*(long *)(puVar14 + -0x20) + 0x78) =
             (ulong)((uint)*(undefined8 *)(*(long *)(puVar14 + -0x20) + 0x78) & 1) | (ulong)ppVar16;
      }
      goto LAB_01db7849;
    }
    if (puVar10 == local_848 + 0x10) {
      (local_840->tctxs).rbt_root = (prof_tctx_t *)0x0;
      goto LAB_01db7849;
    }
  }
  else {
    ppVar19 = (ppVar16->tctx_link).rbn_right_red;
    uVar18 = (ulong)((uint)(tctx->tctx_link).rbn_right_red & 1);
    (ppVar16->tctx_link).rbn_right_red =
         (prof_tctx_t *)((ulong)ppVar19 & 0xfffffffffffffffe | uVar18);
    (ppVar16->tctx_link).rbn_left = (tctx->tctx_link).rbn_left;
    (ppVar16->tctx_link).rbn_right_red =
         (prof_tctx_t *)((ulong)(tctx->tctx_link).rbn_right_red & 0xfffffffffffffffe | uVar18);
    (tctx->tctx_link).rbn_right_red =
         (prof_tctx_t *)
         ((ulong)(tctx->tctx_link).rbn_right_red & 0xfffffffffffffffe | (ulong)((uint)ppVar19 & 1));
    *puVar30 = (ulong)ppVar16;
    *(prof_tctx_t **)puVar10 = tctx;
    if (puVar30 == (ulong *)(local_848 + 0x10)) {
      (local_840->tctxs).rbt_root = (prof_tctx_t *)*puVar30;
    }
    else if ((int)puVar30[-1] < 0) {
      *(ulong *)(puVar30[-2] + 0x70) = *puVar30;
    }
    else {
      *(ulong *)(puVar30[-2] + 0x78) =
           (ulong)((uint)*(undefined8 *)(puVar30[-2] + 0x78) & 1) | *puVar30;
    }
  }
  ppVar26 = local_840;
  if ((*(byte *)(*(long *)puVar10 + 0x78) & 1) == 0) {
    *(undefined8 *)(puVar14 + -0x10) = 0;
    plVar4 = (long *)(local_848 + 0x10);
    ppVar16 = (prof_tctx_t *)local_838[0].cache[0].leafkey;
    if (plVar4 <= puVar14 + -0x20) {
      plVar27 = (long *)(puVar14 + -0x30);
      do {
        ppVar19 = (prof_tctx_t *)plVar27[4];
        if (-1 < (int)plVar27[3]) {
          uVar18 = plVar27[2];
          ppVar16 = *(prof_tctx_t **)(uVar18 + 0x70);
          uVar25 = (ulong)((uint)*(undefined8 *)(uVar18 + 0x78) & 1);
          *(ulong *)(uVar18 + 0x78) = uVar25 | (ulong)ppVar19;
          ppVar24 = (ppVar16->tctx_link).rbn_right_red;
          if (((ulong)ppVar24 & 1) == 0) {
            if (uVar25 == 0 && ((ulong)ppVar19 & 1) == 0) {
              ppVar19 = (ppVar16->tctx_link).rbn_left;
              if ((ppVar19 == (prof_tctx_t *)0x0) ||
                 (ppVar23 = (ppVar19->tctx_link).rbn_right_red, ((ulong)ppVar23 & 1) == 0)) {
                (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((ulong)ppVar24 | 1);
                goto LAB_01db7820;
              }
              (ppVar19->tctx_link).rbn_right_red =
                   (prof_tctx_t *)((ulong)ppVar23 & 0xfffffffffffffffe);
              ppVar19 = (ppVar16->tctx_link).rbn_right_red;
              *(ulong *)(uVar18 + 0x70) = (ulong)ppVar19 & 0xfffffffffffffffe;
              (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((uint)ppVar19 & 1 | uVar18);
              goto joined_r0x01db7afd;
            }
            ppVar23 = (ppVar16->tctx_link).rbn_left;
            if ((ppVar23 == (prof_tctx_t *)0x0) ||
               (((ulong)(ppVar23->tctx_link).rbn_right_red & 1) == 0)) {
              (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((ulong)ppVar24 | 1);
              *(byte *)(uVar18 + 0x78) = *(byte *)(uVar18 + 0x78) & 0xfe;
              goto LAB_01db7849;
            }
            *(ulong *)(uVar18 + 0x78) = (ulong)ppVar19 & 0xfffffffffffffffe;
            pppVar3 = &(ppVar16->tctx_link).rbn_right_red;
            *(byte *)pppVar3 = *(byte *)pppVar3 | 1;
            pppVar3 = &(ppVar23->tctx_link).rbn_right_red;
            *(byte *)pppVar3 = *(byte *)pppVar3 & 0xfe;
            ppVar19 = (ppVar16->tctx_link).rbn_right_red;
            *(ulong *)(uVar18 + 0x70) = (ulong)ppVar19 & 0xfffffffffffffffe;
            (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((uint)ppVar19 & 1 | uVar18);
          }
          else {
            lVar17 = *(long *)(((ulong)ppVar24 & 0xfffffffffffffffe) + 0x70);
            if ((lVar17 == 0) || ((*(ulong *)(lVar17 + 0x78) & 1) == 0)) {
              pbVar5 = (byte *)(((ulong)ppVar24 & 0xfffffffffffffffe) + 0x78);
              *pbVar5 = *pbVar5 | 1;
              *(ulong *)(uVar18 + 0x70) =
                   (ulong)(ppVar16->tctx_link).rbn_right_red & 0xfffffffffffffffe;
              (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)(uVar18 & 0xfffffffffffffffe);
            }
            else {
              *(ulong *)(lVar17 + 0x78) = *(ulong *)(lVar17 + 0x78) & 0xfffffffffffffffe;
              ppVar19 = (ppVar16->tctx_link).rbn_right_red;
              ppVar24 = (prof_tctx_t *)((ulong)ppVar19 & 0xfffffffffffffffe);
              *(prof_tctx_t **)(uVar18 + 0x70) = ppVar24;
              (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((uint)ppVar19 & 1 | uVar18);
              ppVar19 = (ppVar24->tctx_link).rbn_right_red;
              *(ulong *)(uVar18 + 0x70) = (ulong)ppVar19 & 0xfffffffffffffffe;
              (ppVar24->tctx_link).rbn_right_red = (prof_tctx_t *)((uint)ppVar19 & 1 | uVar18);
              uVar18 = (ulong)((uint)(ppVar16->tctx_link).rbn_right_red & 1);
              (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((long)&ppVar24->tdata + uVar18);
              (ppVar16->tctx_link).rbn_right_red =
                   (prof_tctx_t *)(uVar18 | (ulong)(ppVar24->tctx_link).rbn_left);
              (ppVar24->tctx_link).rbn_left = ppVar16;
              ppVar16 = ppVar24;
            }
joined_r0x01db7afd:
            if (plVar27 + 2 == plVar4) break;
          }
          if ((int)plVar27[1] < 0) {
            *(prof_tctx_t **)(*plVar27 + 0x70) = ppVar16;
          }
          else {
            *(ulong *)(*plVar27 + 0x78) =
                 (ulong)((uint)*(undefined8 *)(*plVar27 + 0x78) & 1) | (ulong)ppVar16;
          }
          goto LAB_01db7849;
        }
        ppVar16 = (prof_tctx_t *)plVar27[2];
        (ppVar16->tctx_link).rbn_left = ppVar19;
        ppVar19 = (ppVar16->tctx_link).rbn_right_red;
        if (((ulong)ppVar19 & 1) != 0) {
          ppVar19 = (prof_tctx_t *)((ulong)ppVar19 & 0xfffffffffffffffe);
          ppVar24 = (ppVar19->tctx_link).rbn_left;
          if ((ppVar24 == (prof_tctx_t *)0x0) ||
             (((ulong)(ppVar24->tctx_link).rbn_right_red & 1) == 0)) {
            ppVar24 = (prof_tctx_t *)((ulong)ppVar24 | 1);
          }
          else {
            (ppVar16->tctx_link).rbn_right_red = ppVar19;
            ppVar23 = (ppVar24->tctx_link).rbn_right_red;
            (ppVar19->tctx_link).rbn_left = (prof_tctx_t *)((ulong)ppVar23 & 0xfffffffffffffffe);
            (ppVar24->tctx_link).rbn_right_red =
                 (prof_tctx_t *)((ulong)((uint)ppVar23 & 1) | (ulong)ppVar19);
            ppVar23 = (prof_tctx_t *)
                      ((ulong)((uint)(ppVar16->tctx_link).rbn_right_red & 1) | (ulong)ppVar24);
            (ppVar16->tctx_link).rbn_right_red = ppVar23;
            ppVar19 = (prof_tctx_t *)((ulong)ppVar24 & 0xfffffffffffffffe);
            ppVar24 = (prof_tctx_t *)
                      ((ulong)((uint)ppVar23 & 1) | (ulong)(ppVar19->tctx_link).rbn_left);
          }
          (ppVar16->tctx_link).rbn_right_red = ppVar24;
          (ppVar19->tctx_link).rbn_left = ppVar16;
          if ((int)plVar27[1] < 0) {
            *(prof_tctx_t **)(*plVar27 + 0x70) = ppVar19;
          }
          else {
            lVar17 = *plVar27;
            uVar18 = (ulong)((uint)*(undefined8 *)(lVar17 + 0x78) & 1) | (ulong)ppVar19;
LAB_01db7bb6:
            *(ulong *)(lVar17 + 0x78) = uVar18;
          }
          goto LAB_01db7849;
        }
        ppVar24 = (ppVar19->tctx_link).rbn_left;
        if ((ppVar24 != (prof_tctx_t *)0x0) &&
           (ppVar23 = (ppVar24->tctx_link).rbn_right_red, ((ulong)ppVar23 & 1) != 0)) {
          ppVar23 = (prof_tctx_t *)((ulong)ppVar23 & 0xfffffffffffffffe);
          (ppVar24->tctx_link).rbn_right_red = ppVar23;
          (ppVar19->tctx_link).rbn_left = ppVar23;
          (ppVar24->tctx_link).rbn_right_red = ppVar19;
          ppVar19 = (prof_tctx_t *)
                    ((ulong)((uint)(ppVar16->tctx_link).rbn_right_red & 1) | (ulong)ppVar24);
          (ppVar16->tctx_link).rbn_right_red = ppVar19;
          ppVar24 = (prof_tctx_t *)((ulong)ppVar24 & 0xfffffffffffffffe);
          (ppVar16->tctx_link).rbn_right_red =
               (prof_tctx_t *)((ulong)((uint)ppVar19 & 1) | (ulong)(ppVar24->tctx_link).rbn_left);
          (ppVar24->tctx_link).rbn_left = ppVar16;
          if (plVar27 + 2 == plVar4) {
            (ppVar26->tctxs).rbt_root = ppVar24;
          }
          else {
            lVar17 = *plVar27;
            if (-1 < (int)plVar27[1]) {
              uVar18 = (ulong)((uint)*(undefined8 *)(lVar17 + 0x78) & 1) | (ulong)ppVar24;
              goto LAB_01db7bb6;
            }
            *(prof_tctx_t **)(lVar17 + 0x70) = ppVar24;
          }
          goto LAB_01db7849;
        }
        (ppVar16->tctx_link).rbn_right_red = (prof_tctx_t *)((ulong)ppVar24 | 1);
        (ppVar19->tctx_link).rbn_left = ppVar16;
        plVar27[2] = (long)ppVar19;
LAB_01db7820:
        bVar32 = plVar4 <= plVar27;
        ppVar16 = (prof_tctx_t *)local_838[0].cache[0].leafkey;
        plVar27 = plVar27 + -2;
      } while (bVar32);
    }
    (ppVar26->tctxs).rbt_root = ppVar16;
  }
  else {
    *(undefined8 *)(*(long *)(puVar14 + -0x20) + 0x70) = 0;
  }
LAB_01db7849:
  if (((duckdb_je_opt_prof_accum == false) && ((ppVar26->tctxs).rbt_root == (prof_tctx_t *)0x0)) &&
     (ppVar26->nlimbo == 0)) {
    ppVar26->nlimbo = 1;
  }
  pmVar22 = ppVar26->lock;
  (pmVar22->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar22->field_0 + 0x48));
  if (tsd == (tsd_t *)0x0) {
    prVar31 = (rtree_ctx_t *)(local_848 + 0x10);
    duckdb_je_rtree_ctx_data_init(prVar31);
  }
  else {
    prVar31 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar29 = (uint)((ulong)tctx >> 0x1e) & 0xf;
  prVar28 = (rtree_leaf_elm_t *)((ulong)tctx & 0xffffffffc0000000);
  uVar18 = (ulong)(uVar29 << 4);
  puVar7 = (undefined8 *)((long)&prVar31->cache[0].leafkey + uVar18);
  prVar15 = *(rtree_leaf_elm_t **)((long)&prVar31->cache[0].leafkey + uVar18);
  if (prVar15 == prVar28) {
    prVar15 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tctx >> 9) & 0x1ffff8) + puVar7[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar31->l2_cache[0].leafkey == prVar28) {
    prVar9 = prVar31->l2_cache[0].leaf;
    prVar31->l2_cache[0].leafkey = (uintptr_t)prVar15;
    prVar31->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar7[1];
    *puVar7 = prVar28;
    puVar7[1] = prVar9;
    prVar15 = (rtree_leaf_elm_t *)
              ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)tctx >> 9) & 0x1ffff8));
  }
  else {
    prVar20 = prVar31->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar31->l2_cache[1].leafkey == prVar28) {
      uVar18 = 0;
      bVar32 = false;
    }
    else {
      uVar18 = 0;
      prVar21 = prVar20;
      do {
        if (uVar18 == 6) {
          bVar32 = true;
          goto LAB_01db7cc6;
        }
        prVar20 = prVar21 + 1;
        uVar18 = uVar18 + 1;
        prVar6 = prVar21 + 1;
        prVar21 = prVar20;
      } while ((rtree_leaf_elm_t *)prVar6->leafkey != prVar28);
      bVar32 = 6 < uVar18;
    }
    prVar9 = prVar20->leaf;
    prVar20->leafkey = prVar31->l2_cache[uVar18].leafkey;
    prVar20->leaf = prVar31->l2_cache[uVar18].leaf;
    prVar31->l2_cache[uVar18].leafkey = (uintptr_t)prVar15;
    prVar31->l2_cache[uVar18].leaf = (rtree_leaf_elm_t *)puVar7[1];
    *puVar7 = prVar28;
    puVar7[1] = prVar9;
    prVar15 = (rtree_leaf_elm_t *)
              ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)tctx >> 9) & 0x1ffff8));
LAB_01db7cc6:
    if (bVar32) {
      prVar15 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar31,(uintptr_t)tctx,
                           true,false);
    }
  }
  pvVar8 = duckdb_je_arenas
           [*(uint *)(((long)(prVar15->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff]
           .repr;
  if (tsd == (tsd_t *)0x0) {
    prVar31 = (rtree_ctx_t *)(local_848 + 0x10);
    duckdb_je_rtree_ctx_data_init(prVar31);
  }
  else {
    prVar31 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar18 = (ulong)(uVar29 << 4);
  puVar7 = (undefined8 *)((long)&prVar31->cache[0].leafkey + uVar18);
  prVar15 = *(rtree_leaf_elm_t **)((long)&prVar31->cache[0].leafkey + uVar18);
  if (prVar15 == prVar28) {
    prVar15 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tctx >> 9) & 0x1ffff8) + puVar7[1]);
  }
  else if ((rtree_leaf_elm_t *)prVar31->l2_cache[0].leafkey == prVar28) {
    prVar9 = prVar31->l2_cache[0].leaf;
    prVar31->l2_cache[0].leafkey = (uintptr_t)prVar15;
    prVar31->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar7[1];
    *puVar7 = prVar28;
    puVar7[1] = prVar9;
    prVar15 = (rtree_leaf_elm_t *)
              ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)tctx >> 9) & 0x1ffff8));
  }
  else {
    prVar20 = prVar31->l2_cache + 1;
    if ((rtree_leaf_elm_t *)prVar31->l2_cache[1].leafkey == prVar28) {
      uVar18 = 0;
      bVar32 = false;
    }
    else {
      uVar18 = 0;
      prVar21 = prVar20;
      do {
        if (uVar18 == 6) {
          bVar32 = true;
          goto LAB_01db7d4a;
        }
        prVar20 = prVar21 + 1;
        uVar18 = uVar18 + 1;
        prVar6 = prVar21 + 1;
        prVar21 = prVar20;
      } while ((rtree_leaf_elm_t *)prVar6->leafkey != prVar28);
      bVar32 = 6 < uVar18;
    }
    prVar9 = prVar20->leaf;
    prVar20->leafkey = prVar31->l2_cache[uVar18].leafkey;
    prVar20->leaf = prVar31->l2_cache[uVar18].leaf;
    prVar31->l2_cache[uVar18].leafkey = (uintptr_t)prVar15;
    prVar31->l2_cache[uVar18].leaf = (rtree_leaf_elm_t *)puVar7[1];
    *puVar7 = prVar28;
    puVar7[1] = prVar9;
    prVar15 = (rtree_leaf_elm_t *)
              ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)tctx >> 9) & 0x1ffff8));
LAB_01db7d4a:
    if (bVar32) {
      prVar15 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar31,(uintptr_t)tctx,
                           true,false);
    }
  }
  LOCK();
  plVar4 = (long *)((long)pvVar8 + 0x48);
  *plVar4 = *plVar4 - duckdb_je_sz_index2size_tab[(ulong)(prVar15->le_bits).repr >> 0x30];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd,tctx);
  return;
}

Assistant:

void
prof_tctx_try_destroy(tsd_t *tsd, prof_tctx_t *tctx) {
	malloc_mutex_assert_owner(tsd_tsdn(tsd), tctx->tdata->lock);
	if (prof_tctx_should_destroy(tsd, tctx)) {
		/* tctx->tdata->lock will be released in prof_tctx_destroy(). */
		prof_tctx_destroy(tsd, tctx);
	} else {
		malloc_mutex_unlock(tsd_tsdn(tsd), tctx->tdata->lock);
	}
}